

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O0

void __thiscall
Assimp::X3DImporter::GeometryHelper_MakeQL_RectParallelepiped
          (X3DImporter *this,aiVector3D *pSize,
          list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pVertices)

{
  float pX;
  float pY;
  float pZ;
  float pX_00;
  float pY_00;
  float pZ_00;
  aiVector3t<float> *local_b0;
  float hs;
  float z2;
  float z1;
  float y2;
  float y1;
  float x2;
  float x1;
  aiVector3D vert_set [8];
  list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pVertices_local;
  aiVector3D *pSize_local;
  X3DImporter *this_local;
  
  local_b0 = (aiVector3t<float> *)&x2;
  do {
    aiVector3t<float>::aiVector3t(local_b0);
    local_b0 = local_b0 + 1;
  } while (local_b0 != (aiVector3t<float> *)&vert_set[7].y);
  pX_00 = pSize->x / 2.0;
  pX = -pX_00;
  pY_00 = pSize->y / 2.0;
  pY = -pY_00;
  pZ_00 = pSize->z / 2.0;
  pZ = -pZ_00;
  aiVector3t<float>::Set((aiVector3t<float> *)&x2,pX_00,pY,pZ_00);
  aiVector3t<float>::Set((aiVector3t<float> *)&vert_set[0].y,pX_00,pY_00,pZ_00);
  aiVector3t<float>::Set((aiVector3t<float> *)&vert_set[1].y,pX_00,pY_00,pZ);
  aiVector3t<float>::Set((aiVector3t<float> *)&vert_set[2].y,pX_00,pY,pZ);
  aiVector3t<float>::Set((aiVector3t<float> *)&vert_set[3].y,pX,pY,pZ_00);
  aiVector3t<float>::Set((aiVector3t<float> *)&vert_set[4].y,pX,pY_00,pZ_00);
  aiVector3t<float>::Set((aiVector3t<float> *)&vert_set[5].y,pX,pY_00,pZ);
  aiVector3t<float>::Set((aiVector3t<float> *)&vert_set[6].y,pX,pY,pZ);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,(value_type *)&vert_set[2].y);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,(value_type *)&vert_set[1].y);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,(value_type *)&vert_set[0].y);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,(value_type *)&x2);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,(value_type *)&vert_set[5].y);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,(value_type *)&vert_set[6].y);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,(value_type *)&vert_set[3].y);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,(value_type *)&vert_set[4].y);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,(value_type *)&vert_set[6].y);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,(value_type *)&vert_set[2].y);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,(value_type *)&x2);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,(value_type *)&vert_set[3].y);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,(value_type *)&vert_set[1].y);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,(value_type *)&vert_set[5].y);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,(value_type *)&vert_set[4].y);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,(value_type *)&vert_set[0].y);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,(value_type *)&x2);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,(value_type *)&vert_set[0].y);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,(value_type *)&vert_set[4].y);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,(value_type *)&vert_set[3].y);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,(value_type *)&vert_set[6].y);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,(value_type *)&vert_set[5].y);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,(value_type *)&vert_set[1].y);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,(value_type *)&vert_set[2].y);
  return;
}

Assistant:

void X3DImporter::GeometryHelper_MakeQL_RectParallelepiped(const aiVector3D& pSize, std::list<aiVector3D>& pVertices)
{
	MESH_RectParallelepiped_CREATE_VERT;
	MACRO_FACE_ADD_QUAD_FA(true, pVertices, vert_set, 3, 2, 1, 0);// front
	MACRO_FACE_ADD_QUAD_FA(true, pVertices, vert_set, 6, 7, 4, 5);// back
	MACRO_FACE_ADD_QUAD_FA(true, pVertices, vert_set, 7, 3, 0, 4);// left
	MACRO_FACE_ADD_QUAD_FA(true, pVertices, vert_set, 2, 6, 5, 1);// right
	MACRO_FACE_ADD_QUAD_FA(true, pVertices, vert_set, 0, 1, 5, 4);// top
	MACRO_FACE_ADD_QUAD_FA(true, pVertices, vert_set, 7, 6, 2, 3);// bottom
}